

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [50],
                   static_string_view *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [32],char **args_4,char (*args_5) [11],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   char (*args_7) [3])

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_t local_c0;
  char *pcStack_b8;
  size_t local_b0;
  char (*local_a8) [50];
  size_t local_a0;
  char *pcStack_98;
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [32];
  size_t local_70;
  char *local_68;
  size_t local_60;
  char (*local_58) [11];
  size_type local_50;
  pointer local_48;
  size_t local_40;
  char (*local_38) [3];
  
  local_d0._M_len = (a->View_)._M_len;
  local_d0._M_str = (a->View_)._M_str;
  local_c0 = (b->View_)._M_len;
  pcStack_b8 = (b->View_)._M_str;
  local_b0 = strlen(*args);
  local_a0 = (args_1->super_string_view)._M_len;
  pcStack_98 = (args_1->super_string_view)._M_str;
  local_88 = (args_2->_M_dataplus)._M_p;
  local_90 = args_2->_M_string_length;
  local_a8 = args;
  local_80 = strlen(*args_3);
  local_78 = args_3;
  __s = *args_4;
  local_70 = strlen(__s);
  local_68 = __s;
  local_60 = strlen(*args_5);
  local_58 = args_5;
  local_48 = (args_6->_M_dataplus)._M_p;
  local_50 = args_6->_M_string_length;
  local_40 = strlen(*args_7);
  local_38 = args_7;
  views._M_len = 10;
  views._M_array = &local_d0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}